

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

_Bool iter_linear_next(hdr_iter *iter)

{
  int64_t *piVar1;
  hdr_histogram *h;
  _Bool _Var2;
  int64_t iVar3;
  long lVar4;
  
  (iter->specifics).percentiles.percentile_to_iterate_to = 0.0;
  if ((iter->total_count <= iter->cumulative_count) &&
     (_Var2 = next_value_greater_than_reporting_level_upper_bound
                        (iter,(iter->specifics).linear.next_value_reporting_level_lowest_equivalent)
     , !_Var2)) {
    return false;
  }
  while( true ) {
    if ((iter->specifics).linear.next_value_reporting_level_lowest_equivalent <= iter->value) {
      lVar4 = (iter->specifics).linear.next_value_reporting_level;
      h = iter->h;
      iter->value_iterated_from = iter->value_iterated_to;
      iter->value_iterated_to = lVar4;
      lVar4 = lVar4 + (iter->specifics).linear.value_units_per_bucket;
      (iter->specifics).linear.next_value_reporting_level = lVar4;
      iVar3 = lowest_equivalent_value(h,lVar4);
      (iter->specifics).linear.next_value_reporting_level_lowest_equivalent = iVar3;
      return true;
    }
    _Var2 = move_next(iter);
    if (!_Var2) break;
    piVar1 = &(iter->specifics).linear.count_added_in_this_iteration_step;
    *piVar1 = *piVar1 + iter->count;
  }
  return true;
}

Assistant:

static bool iter_linear_next(struct hdr_iter* iter)
{
    struct hdr_iter_linear* linear = &iter->specifics.linear;

    linear->count_added_in_this_iteration_step = 0;

    if (has_next(iter) ||
        next_value_greater_than_reporting_level_upper_bound(
            iter, linear->next_value_reporting_level_lowest_equivalent))
    {
        do
        {
            if (iter->value >= linear->next_value_reporting_level_lowest_equivalent)
            {
                update_iterated_values(iter, linear->next_value_reporting_level);

                linear->next_value_reporting_level += linear->value_units_per_bucket;
                linear->next_value_reporting_level_lowest_equivalent =
                    lowest_equivalent_value(iter->h, linear->next_value_reporting_level);

                return true;
            }

            if (!move_next(iter))
            {
                return true;
            }

            linear->count_added_in_this_iteration_step += iter->count;
        }
        while (true);
    }

    return false;
}